

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

void __thiscall tinyxml2::StrPair::CollapseWhitespace(StrPair *this)

{
  bool bVar1;
  char *pcVar2;
  char *local_20;
  char *q;
  char *p;
  StrPair *this_local;
  
  pcVar2 = XMLUtil::SkipWhiteSpace(this->_start);
  this->_start = pcVar2;
  if (*this->_start != '\0') {
    local_20 = this->_start;
    for (q = this->_start; *q != '\0'; q = q + 1) {
      bVar1 = XMLUtil::IsWhiteSpace(*q);
      if (bVar1) {
        q = XMLUtil::SkipWhiteSpace(q);
        if (*q == '\0') break;
        *local_20 = ' ';
        local_20 = local_20 + 1;
      }
      *local_20 = *q;
      local_20 = local_20 + 1;
    }
    *local_20 = '\0';
  }
  return;
}

Assistant:

void StrPair::CollapseWhitespace()
{
    // Adjusting _start would cause undefined behavior on delete[]
    TIXMLASSERT( ( _flags & NEEDS_DELETE ) == 0 );
    // Trim leading space.
    _start = XMLUtil::SkipWhiteSpace( _start );

    if ( *_start ) {
        char* p = _start;	// the read pointer
        char* q = _start;	// the write pointer

        while( *p ) {
            if ( XMLUtil::IsWhiteSpace( *p )) {
                p = XMLUtil::SkipWhiteSpace( p );
                if ( *p == 0 ) {
                    break;    // don't write to q; this trims the trailing space.
                }
                *q = ' ';
                ++q;
            }
            *q = *p;
            ++q;
            ++p;
        }
        *q = 0;
    }
}